

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::evaluate(SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  SelectionSet bs;
  SelectionSet SStack_28;
  
  createSelectionSets(&SStack_28,this);
  if (this->isLoaded_ == true) {
    this->pc = 0;
    instructionDispatchLoop(this,&SStack_28);
  }
  SelectionSet::parallelReduce(__return_storage_ptr__,&SStack_28);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&SStack_28.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::evaluate() {
    SelectionSet bs = createSelectionSets();
    if (isLoaded_) {
      pc = 0;
      instructionDispatchLoop(bs);
    }
    return bs.parallelReduce();
  }